

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_resize.c
# Opt level: O1

int CVodeResizeHistory(void *cvode_mem,sunrealtype *t_hist,N_Vector *y_hist,N_Vector *f_hist,
                      int num_y_hist,int num_f_hist)

{
  N_Vector *zn;
  uint uVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  undefined8 uVar6;
  long lVar7;
  SUNNonlinearSolver NLS;
  N_Vector p_Var8;
  N_Vector p_Var9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  char *pcVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  N_Vector resize_wrk [13];
  N_Vector local_98 [13];
  
  if (cvode_mem == (void *)0x0) {
    pcVar13 = "cvode_mem = NULL illegal.";
    cvode_mem = (CVodeMem)0x0;
    iVar4 = -0x15;
    iVar3 = 0xca;
    goto LAB_0011869c;
  }
  if (t_hist == (sunrealtype *)0x0) {
    pcVar13 = "Time history array is NULL";
    iVar4 = -0x16;
    iVar3 = 0xd1;
    goto LAB_0011869c;
  }
  if (y_hist == (N_Vector *)0x0) {
    pcVar13 = "State history array is NULL";
    iVar4 = -0x16;
    iVar3 = 0xd8;
    goto LAB_0011869c;
  }
  if (f_hist == (N_Vector *)0x0) {
    pcVar13 = "RHS history array is NULL";
    iVar4 = -0x16;
    iVar3 = 0xdf;
    goto LAB_0011869c;
  }
  uVar12 = *(int *)((long)cvode_mem + 0x120) + 1;
  if ((int)*(uint *)((long)cvode_mem + 0x2c8) <= (int)uVar12) {
    uVar12 = *(uint *)((long)cvode_mem + 0x2c8);
  }
  if (*(int *)((long)cvode_mem + 0x20) == 1) {
    if (num_y_hist < 2) {
      pcVar13 = "Insufficient solution history";
      iVar4 = -0x16;
      iVar3 = 0xeb;
      goto LAB_0011869c;
    }
    if (0 < (int)uVar12) {
      uVar10 = 0;
      do {
        if (f_hist[uVar10] == (N_Vector)0x0) {
          pcVar13 = "Insufficient right-hand side history";
          iVar4 = -0x16;
          iVar3 = 0xf4;
          goto LAB_0011869c;
        }
        uVar10 = uVar10 + 1;
      } while (uVar12 != uVar10);
    }
  }
  else {
    if (num_f_hist < 2) {
      pcVar13 = "Insufficient right-hand side history";
      iVar4 = -0x16;
      iVar3 = 0xfe;
      goto LAB_0011869c;
    }
    if (0 < (int)uVar12) {
      uVar10 = 0;
      do {
        if (y_hist[uVar10] == (N_Vector)0x0) {
          pcVar13 = "Insufficient solution history";
          iVar4 = -0x16;
          iVar3 = 0x107;
          goto LAB_0011869c;
        }
        uVar10 = uVar10 + 1;
      } while (uVar12 != uVar10);
    }
  }
  N_VDestroy(*(undefined8 *)((long)cvode_mem + 200));
  lVar5 = N_VClone(*y_hist);
  *(long *)((long)cvode_mem + 200) = lVar5;
  if (lVar5 == 0) {
    pcVar13 = "A vector allocation failed";
    iVar4 = -0x14;
    iVar3 = 0x116;
    goto LAB_0011869c;
  }
  N_VDestroy(*(undefined8 *)((long)cvode_mem + 0xd8));
  lVar5 = N_VClone(*y_hist);
  *(long *)((long)cvode_mem + 0xd8) = lVar5;
  if (lVar5 == 0) {
    pcVar13 = "A vector allocation failed";
    iVar4 = -0x14;
    iVar3 = 0x11f;
    goto LAB_0011869c;
  }
  N_VDestroy(*(undefined8 *)((long)cvode_mem + 0xe0));
  lVar5 = N_VClone(*y_hist);
  *(long *)((long)cvode_mem + 0xe0) = lVar5;
  if (lVar5 == 0) {
    pcVar13 = "A vector allocation failed";
    iVar4 = -0x14;
    iVar3 = 0x128;
    goto LAB_0011869c;
  }
  N_VDestroy(*(undefined8 *)((long)cvode_mem + 0xe8));
  lVar5 = N_VClone(*y_hist);
  *(long *)((long)cvode_mem + 0xe8) = lVar5;
  if (lVar5 == 0) {
    pcVar13 = "A vector allocation failed";
    iVar4 = -0x14;
    iVar3 = 0x131;
    goto LAB_0011869c;
  }
  N_VDestroy(*(undefined8 *)((long)cvode_mem + 0xf0));
  lVar5 = N_VClone(*y_hist);
  *(long *)((long)cvode_mem + 0xf0) = lVar5;
  if (lVar5 == 0) {
    pcVar13 = "A vector allocation failed";
    iVar4 = -0x14;
    iVar3 = 0x13a;
    goto LAB_0011869c;
  }
  N_VDestroy(*(undefined8 *)((long)cvode_mem + 0xf8));
  lVar5 = N_VClone(*y_hist);
  *(long *)((long)cvode_mem + 0xf8) = lVar5;
  if (lVar5 == 0) {
    pcVar13 = "A vector allocation failed";
    iVar4 = -0x14;
    iVar3 = 0x143;
    goto LAB_0011869c;
  }
  N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x100));
  lVar5 = N_VClone(*y_hist);
  *(long *)((long)cvode_mem + 0x100) = lVar5;
  if (lVar5 == 0) {
    pcVar13 = "A vector allocation failed";
    iVar4 = -0x14;
    iVar3 = 0x14c;
    goto LAB_0011869c;
  }
  if (*(int *)((long)cvode_mem + 0x468) != 0) {
    N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x38));
    uVar6 = N_VClone(*y_hist);
    *(undefined8 *)((long)cvode_mem + 0x38) = uVar6;
  }
  if (*(int *)((long)cvode_mem + 0x470) != 0) {
    N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x108));
    *(undefined4 *)((long)cvode_mem + 0x470) = 0;
    *(undefined4 *)((long)cvode_mem + 0x58) = 0;
  }
  bVar2 = (byte)((uint)*(int *)((long)cvode_mem + 0x460) >> 0x18);
  bVar16 = (bool)(bVar2 >> 7);
  iVar4 = -0x16;
  if (-1 < *(int *)((long)cvode_mem + 0x460)) {
    N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x60));
    lVar5 = N_VClone(*y_hist);
    *(long *)((long)cvode_mem + 0x60) = lVar5;
    bVar16 = (bool)(bVar2 >> 7);
    if (lVar5 != 0) {
      lVar5 = 0;
      do {
        bVar16 = *(int *)((long)cvode_mem + 0x460) <= lVar5;
        if (*(int *)((long)cvode_mem + 0x460) <= lVar5) goto LAB_001184b6;
        N_VDestroy(*(undefined8 *)((long)cvode_mem + lVar5 * 8 + 0x68));
        lVar7 = N_VClone(*y_hist);
        *(long *)((long)cvode_mem + lVar5 * 8 + 0x68) = lVar7;
        lVar5 = lVar5 + 1;
      } while (lVar7 != 0);
    }
    iVar4 = -0x14;
    cvProcessError((CVodeMem)cvode_mem,-0x14,0x166,"CVodeResizeHistory",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_resize.c"
                   ,"A vector allocation failed");
  }
LAB_001184b6:
  if (bVar16 == false) {
    return iVar4;
  }
  if ((*(long *)((long)cvode_mem + 0x3d0) != 0) && (*(int *)((long)cvode_mem + 0x3d8) != 0)) {
    iVar3 = SUNNonlinSolFree();
    if (iVar3 != 0) {
      pcVar13 = "Destroying the Newton solver failed";
      iVar4 = -0x14;
      iVar3 = 0x175;
      goto LAB_0011869c;
    }
    *(undefined8 *)((long)cvode_mem + 0x3d0) = 0;
    *(undefined4 *)((long)cvode_mem + 0x3d8) = 0;
    NLS = SUNNonlinSol_Newton(*y_hist,*cvode_mem);
    if (NLS == (SUNNonlinearSolver)0x0) {
      pcVar13 = "Error creating the Newton solver";
      iVar3 = 0x17f;
LAB_0011874e:
      bVar16 = false;
      iVar4 = -0x14;
      cvProcessError((CVodeMem)cvode_mem,-0x14,iVar3,"CVodeResizeHistory",
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_resize.c"
                     ,pcVar13);
    }
    else {
      iVar3 = CVodeSetNonlinearSolver(cvode_mem,NLS);
      if (iVar3 != 0) {
        SUNNonlinSolFree(NLS);
        pcVar13 = "Error attaching default Newton solver";
        iVar3 = 0x188;
        goto LAB_0011874e;
      }
      *(undefined4 *)((long)cvode_mem + 0x3d8) = 1;
      bVar16 = true;
    }
    if (!bVar16) {
      return iVar4;
    }
  }
  iVar3 = *(int *)((long)cvode_mem + 0x124);
  if (*(int *)((long)cvode_mem + 0x124) < *(int *)((long)cvode_mem + 0x120)) {
    iVar3 = *(int *)((long)cvode_mem + 0x120);
  }
  uVar1 = (uint)(*(int *)((long)cvode_mem + 0x20) == 2);
  bVar16 = 0 < (int)(iVar3 + uVar1);
  uVar11 = iVar3 + uVar1;
  uVar10 = (ulong)uVar11;
  if (uVar11 != 0 && SCARRY4(iVar3,uVar1) == (int)uVar11 < 0) {
    p_Var8 = (N_Vector)N_VClone(*y_hist);
    local_98[0] = p_Var8;
    if (p_Var8 == (N_Vector)0x0) {
      uVar15 = 0;
    }
    else {
      uVar14 = 1;
      do {
        uVar15 = uVar14;
        if (uVar10 == uVar15) {
          bVar16 = uVar15 < uVar10;
          goto LAB_00118845;
        }
        p_Var9 = (N_Vector)N_VClone(*y_hist);
        local_98[uVar15] = p_Var9;
        uVar14 = uVar15 + 1;
      } while (p_Var9 != (N_Vector)0x0);
      bVar16 = uVar15 < uVar10;
    }
    if (p_Var8 != (N_Vector)0x0) {
      uVar14 = 0;
      do {
        N_VDestroy(local_98[uVar14]);
        uVar14 = uVar14 + 1;
      } while (uVar15 != uVar14);
    }
    iVar4 = -0x14;
    cvProcessError((CVodeMem)cvode_mem,-0x14,0x19e,"CVodeResizeHistory",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_resize.c"
                   ,"A vector allocation failed");
  }
LAB_00118845:
  if (bVar16) {
    return iVar4;
  }
  iVar4 = *(int *)((long)cvode_mem + 0x120);
  if (iVar4 < *(int *)((long)cvode_mem + 0x2c8)) {
    zn = (N_Vector *)((long)cvode_mem + 0x60);
    if (*(int *)((long)cvode_mem + 0x20) == 1) {
      iVar4 = cvBuildNordsieckArrayAdams
                        (t_hist + 1,y_hist[1],f_hist + 1,local_98,iVar4,
                         *(sunrealtype *)((long)cvode_mem + 0x160),zn);
    }
    else {
      iVar4 = cvBuildNordsieckArrayBDF
                        (t_hist + 1,y_hist + 1,f_hist[1],local_98,iVar4,
                         *(sunrealtype *)((long)cvode_mem + 0x160),zn);
    }
    if (iVar4 != 0) {
      pcVar13 = "Building the Nordsieck array failed";
      iVar3 = 0x1bb;
      goto LAB_0011869c;
    }
    cvPredictY(*(int *)((long)cvode_mem + 0x120),zn,*(N_Vector *)((long)cvode_mem + 0xf0));
    N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,*y_hist,
                 *(undefined8 *)((long)cvode_mem + 0xf0),
                 *(undefined8 *)
                  ((long)cvode_mem + (long)*(int *)((long)cvode_mem + 0x2c8) * 8 + 0x60));
  }
  if (*(int *)((long)cvode_mem + 0x20) == 1) {
    iVar4 = cvBuildNordsieckArrayAdams
                      (t_hist,*y_hist,f_hist,local_98,*(int *)((long)cvode_mem + 0x124),
                       *(sunrealtype *)((long)cvode_mem + 0x160),
                       (N_Vector *)((long)cvode_mem + 0x60));
  }
  else {
    iVar4 = cvBuildNordsieckArrayBDF
                      (t_hist,y_hist,*f_hist,local_98,*(int *)((long)cvode_mem + 0x124),
                       *(sunrealtype *)((long)cvode_mem + 0x160),
                       (N_Vector *)((long)cvode_mem + 0x60));
  }
  if (iVar4 == 0) {
    *(sunrealtype *)((long)cvode_mem + 0x168) = *t_hist;
    if (1 < (int)uVar12) {
      lVar5 = 0;
      do {
        *(double *)((long)cvode_mem + lVar5 * 8 + 0x180) = t_hist[lVar5] - t_hist[lVar5 + 1];
        lVar5 = lVar5 + 1;
      } while ((ulong)uVar12 - 1 != lVar5);
    }
    *(undefined4 *)((long)cvode_mem + 0x72c) = 1;
    if (0 < (int)uVar11) {
      uVar15 = 0;
      do {
        N_VDestroy(local_98[uVar15]);
        uVar15 = uVar15 + 1;
      } while (uVar10 != uVar15);
      return 0;
    }
    return 0;
  }
  pcVar13 = "Building the Nordsieck array failed";
  iVar3 = 0x1e2;
LAB_0011869c:
  cvProcessError((CVodeMem)cvode_mem,iVar4,iVar3,"CVodeResizeHistory",
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_resize.c"
                 ,pcVar13);
  return iVar4;
}

Assistant:

int CVodeResizeHistory(void* cvode_mem, sunrealtype* t_hist, N_Vector* y_hist,
                       N_Vector* f_hist, int num_y_hist, int num_f_hist)
{
  int retval = 0;

  /* ------------ *
   * Check inputs *
   * ------------ */

  if (!cvode_mem)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return CV_MEM_NULL;
  }
  CVodeMem cv_mem = (CVodeMem)cvode_mem;

  if (!t_hist)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Time history array is NULL");
    return CV_ILL_INPUT;
  }

  if (!y_hist)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "State history array is NULL");
    return CV_ILL_INPUT;
  }

  if (!f_hist)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "RHS history array is NULL");
    return CV_ILL_INPUT;
  }

  /* Check that the input history is sufficient for the current (next) order */
  int n_hist = SUNMIN(cv_mem->cv_q + 1, cv_mem->cv_qmax);

  if (cv_mem->cv_lmm == CV_ADAMS)
  {
    if (num_y_hist < 2)
    {
      cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                     "Insufficient solution history");
      return CV_ILL_INPUT;
    }

    for (int i = 0; i < n_hist; i++)
    {
      if (!f_hist[i])
      {
        cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                       "Insufficient right-hand side history");
        return CV_ILL_INPUT;
      }
    }
  }
  else
  {
    if (num_f_hist < 2)
    {
      cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                     "Insufficient right-hand side history");
      return CV_ILL_INPUT;
    }

    for (int i = 0; i < n_hist; i++)
    {
      if (!y_hist[i])
      {
        cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                       "Insufficient solution history");
        return CV_ILL_INPUT;
      }
    }
  }

  /* -------------- *
   * Resize vectors *
   * -------------- */

  N_VDestroy(cv_mem->cv_ewt);
  cv_mem->cv_ewt = N_VClone(y_hist[0]);
  if (!(cv_mem->cv_ewt))
  {
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   "A vector allocation failed");
    return CV_MEM_FAIL;
  }

  N_VDestroy(cv_mem->cv_acor);
  cv_mem->cv_acor = N_VClone(y_hist[0]);
  if (!(cv_mem->cv_acor))
  {
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   "A vector allocation failed");
    return CV_MEM_FAIL;
  }

  N_VDestroy(cv_mem->cv_tempv);
  cv_mem->cv_tempv = N_VClone(y_hist[0]);
  if (!(cv_mem->cv_tempv))
  {
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   "A vector allocation failed");
    return CV_MEM_FAIL;
  }

  N_VDestroy(cv_mem->cv_ftemp);
  cv_mem->cv_ftemp = N_VClone(y_hist[0]);
  if (!(cv_mem->cv_ftemp))
  {
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   "A vector allocation failed");
    return CV_MEM_FAIL;
  }

  N_VDestroy(cv_mem->cv_vtemp1);
  cv_mem->cv_vtemp1 = N_VClone(y_hist[0]);
  if (!(cv_mem->cv_vtemp1))
  {
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   "A vector allocation failed");
    return CV_MEM_FAIL;
  }

  N_VDestroy(cv_mem->cv_vtemp2);
  cv_mem->cv_vtemp2 = N_VClone(y_hist[0]);
  if (!(cv_mem->cv_vtemp2))
  {
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   "A vector allocation failed");
    return CV_MEM_FAIL;
  }

  N_VDestroy(cv_mem->cv_vtemp3);
  cv_mem->cv_vtemp3 = N_VClone(y_hist[0]);
  if (!(cv_mem->cv_vtemp3))
  {
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   "A vector allocation failed");
    return CV_MEM_FAIL;
  }

  /* User will need to set a new vector of absolute tolerances */
  if (cv_mem->cv_VabstolMallocDone)
  {
    N_VDestroy(cv_mem->cv_Vabstol);
    cv_mem->cv_Vabstol = N_VClone(y_hist[0]);
  }

  /* User will need to set a new constraints vector */
  if (cv_mem->cv_constraintsMallocDone)
  {
    N_VDestroy(cv_mem->cv_constraints);
    cv_mem->cv_constraintsMallocDone = SUNFALSE;
    cv_mem->cv_constraintsSet        = SUNFALSE;
  }

  for (int j = 0; j <= cv_mem->cv_qmax_alloc; j++)
  {
    N_VDestroy(cv_mem->cv_zn[j]);
    cv_mem->cv_zn[j] = N_VClone(y_hist[0]);
    if (!(cv_mem->cv_zn[j]))
    {
      cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                     "A vector allocation failed");
      return CV_MEM_FAIL;
    }
  }

  /* ----------------------- *
   * Resize nonlinear solver *
   * ----------------------- */

  if (cv_mem->NLS && cv_mem->ownNLS)
  {
    retval = SUNNonlinSolFree(cv_mem->NLS);
    if (retval)
    {
      cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                     "Destroying the Newton solver failed");
      return CV_MEM_FAIL;
    }
    cv_mem->NLS    = NULL;
    cv_mem->ownNLS = SUNFALSE;

    SUNNonlinearSolver NLS = SUNNonlinSol_Newton(y_hist[0], cv_mem->cv_sunctx);
    if (!NLS)
    {
      cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                     "Error creating the Newton solver");
      return CV_MEM_FAIL;
    }

    retval = CVodeSetNonlinearSolver(cv_mem, NLS);
    if (retval)
    {
      SUNNonlinSolFree(NLS);
      cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                     "Error attaching default Newton solver");
      return CV_MEM_FAIL;
    }
    cv_mem->ownNLS = SUNTRUE;
  }

  /* ----------------------------- *
   * Create workspace for resizing *
   * ----------------------------- */

  N_Vector resize_wrk[L_MAX];

  int wrk_space_size = SUNMAX(cv_mem->cv_q, cv_mem->cv_qprime);
  if (cv_mem->cv_lmm == CV_BDF) { wrk_space_size++; }

  for (int j = 0; j < wrk_space_size; j++)
  {
    resize_wrk[j] = N_VClone(y_hist[0]);
    if (!resize_wrk[j])
    {
      for (int i = 0; i < j; i++) { N_VDestroy(resize_wrk[i]); }
      cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                     "A vector allocation failed");
      return CV_MEM_FAIL;
    }
  }

  /* ------------------------------------------------------------------------ *
   * Construct Nordsieck array at the old time but with the new size to
   * compute correction vector at the new state size.
   * ------------------------------------------------------------------------ */

  if (cv_mem->cv_q < cv_mem->cv_qmax)
  {
    /* Compute z_{n-1} with new history size */
    if (cv_mem->cv_lmm == CV_ADAMS)
    {
      retval = cvBuildNordsieckArrayAdams(t_hist + 1, y_hist[1], f_hist + 1,
                                          resize_wrk, cv_mem->cv_q,
                                          cv_mem->cv_hscale, cv_mem->cv_zn);
    }
    else
    {
      retval = cvBuildNordsieckArrayBDF(t_hist + 1, y_hist + 1, f_hist[1],
                                        resize_wrk, cv_mem->cv_q,
                                        cv_mem->cv_hscale, cv_mem->cv_zn);
    }

    if (retval)
    {
      cvProcessError(cv_mem, retval, __LINE__, __func__, __FILE__,
                     "Building the Nordsieck array failed");
      return retval;
    }

    /* Get predicted value */
    retval = cvPredictY(cv_mem->cv_q, cv_mem->cv_zn, cv_mem->cv_vtemp1);

    if (retval)
    {
      cvProcessError(cv_mem, retval, __LINE__, __func__, __FILE__,
                     "Computing the predictor failed");
      return retval;
    }

    /* Resized correction */
    N_VLinearSum(ONE, y_hist[0], -ONE, cv_mem->cv_vtemp1,
                 cv_mem->cv_zn[cv_mem->cv_qmax]);
  }

  /* ----------------------------- *
   * Construct new Nordsieck Array *
   * ----------------------------- */

  if (cv_mem->cv_lmm == CV_ADAMS)
  {
    retval = cvBuildNordsieckArrayAdams(t_hist, y_hist[0], f_hist, resize_wrk,
                                        cv_mem->cv_qprime, cv_mem->cv_hscale,
                                        cv_mem->cv_zn);
  }
  else
  {
    retval = cvBuildNordsieckArrayBDF(t_hist, y_hist, f_hist[0], resize_wrk,
                                      cv_mem->cv_qprime, cv_mem->cv_hscale,
                                      cv_mem->cv_zn);
  }

  if (retval)
  {
    cvProcessError(cv_mem, retval, __LINE__, __func__, __FILE__,
                   "Building the Nordsieck array failed");
    return retval;
  }

  /* ------------------- *
   * Update time history *
   * ------------------- */

  /* Ensure internal time and step history match the input history */
  cv_mem->cv_tn = t_hist[0];

  for (int i = 1; i < n_hist; i++)
  {
    cv_mem->cv_tau[i] = t_hist[i - 1] - t_hist[i];
  }

  /* In the next step, perform initialization needed after a resize */
  cv_mem->first_step_after_resize = SUNTRUE;

  /* ------------------------------ *
   * Destroy workspace for resizing *
   * ------------------------------ */

  for (int i = 0; i < wrk_space_size; i++) { N_VDestroy(resize_wrk[i]); }

  return CV_SUCCESS;
}